

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.h
# Opt level: O0

FieldBase * __thiscall FIX::FieldMap::getFieldRef(FieldMap *this,int tag)

{
  int f;
  bool bVar1;
  FieldNotFound *this_00;
  reference pFVar2;
  allocator<char> local_49;
  string local_48;
  __normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
  local_28;
  __normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
  local_20;
  const_iterator iter;
  int tag_local;
  FieldMap *this_local;
  
  iter._M_current._4_4_ = tag;
  local_20._M_current = (FieldBase *)findTag(this,tag);
  local_28._M_current =
       (FieldBase *)
       std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>::end
                 ((vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_> *)(this + 8));
  bVar1 = __gnu_cxx::operator==(&local_20,&local_28);
  if (!bVar1) {
    pFVar2 = __gnu_cxx::
             __normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
             ::operator*(&local_20);
    return pFVar2;
  }
  this_00 = (FieldNotFound *)__cxa_allocate_exception(0x58);
  f = iter._M_current._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_49);
  FieldNotFound::FieldNotFound(this_00,f,&local_48);
  __cxa_throw(this_00,&FieldNotFound::typeinfo,FieldNotFound::~FieldNotFound);
}

Assistant:

const FieldBase& getFieldRef( int tag )
  const EXCEPT ( FieldNotFound )
  {
    Fields::const_iterator iter = findTag( tag );
    if ( iter == m_fields.end() )
      throw FieldNotFound( tag );
    return (*iter);
  }